

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  bool bVar1;
  const_iterator cVar2;
  pointer pbVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_f8;
  char *local_d8;
  undefined8 local_d0;
  size_type local_c8;
  pointer local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  string *local_98;
  pointer local_90;
  string local_88;
  string local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->IgnoredPaths)._M_t,dir);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header)
  {
    pbVar3 = (this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_90 = (this->Configs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != local_90) {
      local_98 = (string *)&this->DebugBuffer;
      do {
        local_f8._M_string_length = (size_type)(dir->_M_dataplus)._M_p;
        local_f8._M_dataplus._M_p = (pointer)dir->_M_string_length;
        local_f8.field_2._M_allocated_capacity = 0;
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 1;
        local_d8 = (char *)((long)&local_88.field_2 + 8);
        local_88.field_2._M_local_buf[8] = '/';
        local_f8.field_2._8_8_ = 1;
        local_d0 = 0;
        local_c0 = (pbVar3->_M_dataplus)._M_p;
        local_c8 = pbVar3->_M_string_length;
        local_b8 = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_f8;
        local_88.field_2._M_allocated_capacity = (size_type)local_d8;
        cmCatViews(&local_50,views);
        std::__cxx11::string::operator=((string *)file,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((this->super_cmFindCommon).DebugMode == true) {
          local_f8._M_string_length = (size_type)(this->DebugBuffer)._M_dataplus._M_p;
          local_f8._M_dataplus._M_p = (pointer)(this->DebugBuffer)._M_string_length;
          local_f8.field_2._M_allocated_capacity = 0;
          local_f8.field_2._8_8_ = 2;
          local_d8 = "  ";
          local_d0 = 0;
          local_c0 = (file->_M_dataplus)._M_p;
          local_c8 = file->_M_string_length;
          local_b8 = 0;
          local_b0 = 1;
          local_a8 = "\n";
          local_a0 = 0;
          views_00._M_len = 4;
          views_00._M_array = (iterator)&local_f8;
          cmCatViews(&local_88,views_00);
          std::__cxx11::string::operator=(local_98,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            (ulong)(local_88.field_2._M_allocated_capacity + 1));
          }
        }
        bVar1 = cmsys::SystemTools::FileExists(file,true);
        if ((bVar1) && (bVar1 = CheckVersion(this,file), bVar1)) {
          if (this->UseRealPath != true) {
            return true;
          }
          cmsys::SystemTools::GetRealPath(&local_f8,file,(string *)0x0);
          std::__cxx11::string::operator=((string *)file,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
            return true;
          }
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          return true;
        }
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != local_90);
    }
  }
  return false;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir)) {
    return false;
  }

  for (std::string const& c : this->Configs) {
    file = cmStrCat(dir, '/', c);
    if (this->DebugMode) {
      this->DebugBuffer = cmStrCat(this->DebugBuffer, "  ", file, "\n");
    }
    if (cmSystemTools::FileExists(file, true) && this->CheckVersion(file)) {
      // Allow resolving symlinks when the config file is found through a link
      if (this->UseRealPath) {
        file = cmSystemTools::GetRealPath(file);
      }
      return true;
    }
  }
  return false;
}